

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O0

bool WTF::Symbolize(void *pc,char *out,int out_size)

{
  bool bVar1;
  int out_size_local;
  char *out_local;
  void *pc_local;
  
  if (out_size < 0) {
    AssertFail();
  }
  bVar1 = SymbolizeAndDemangle(pc,out,out_size);
  return bVar1;
}

Assistant:

bool Symbolize(void *pc, char *out, int out_size) {
    SAFE_ASSERT(out_size >= 0);
    return SymbolizeAndDemangle(pc, out, out_size);
}